

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cpp
# Opt level: O0

void applyFilePatches(Section *section,Section *dataSection)

{
  ushort uVar1;
  Patch *patch_00;
  char *pcVar2;
  byte local_69;
  byte local_68 [4];
  uint8_t i;
  anon_struct_12_3_b6529935 types [4];
  uint uStack_2c;
  int16_t jumpOffset;
  uint16_t address;
  uint16_t offset;
  int32_t value;
  Patch *patch;
  uint32_t patchID;
  Section *dataSection_local;
  Section *section_local;
  
  if (beVerbose) {
    fprintf(_stderr,"Patching section \"%s\"...\n",section->name);
  }
  for (patch._4_4_ = 0; patch._4_4_ < section->nbPatches; patch._4_4_ = patch._4_4_ + 1) {
    patch_00 = section->patches + patch._4_4_;
    uStack_2c = computeRPNExpr(patch_00,section->fileSymbols);
    uVar1 = (short)patch_00->offset + section->offset;
    if (patch_00->type == PATCHTYPE_JR) {
      types[3].max._2_2_ =
           (short)uStack_2c - (patch_00->pcSection->org + (short)patch_00->pcOffset + 2);
      if (((isError & 1U) == 0) && ((types[3].max._2_2_ < -0x80 || (0x7f < types[3].max._2_2_)))) {
        error(patch_00->src,patch_00->lineNo,"jr target out of reach (expected -129 < %d < 128)",
              (ulong)(uint)(int)types[3].max._2_2_);
      }
      dataSection->data[uVar1] = (uint8_t)types[3].max._2_2_;
    }
    else {
      memcpy(local_68,&DAT_00113ab0,0x30);
      if (((isError & 1U) == 0) &&
         (((int)uStack_2c < *(int *)(&stack0xffffffffffffff9c + (ulong)patch_00->type * 0xc) ||
          (*(int *)(types + patch_00->type) < (int)uStack_2c)))) {
        pcVar2 = "";
        if ((int)uStack_2c < 0) {
          pcVar2 = " (maybe negative?)";
        }
        error(patch_00->src,patch_00->lineNo,"Value %d%s is not %u-bit",(ulong)uStack_2c,pcVar2,
              (ulong)local_68[(ulong)patch_00->type * 0xc] << 3);
      }
      for (local_69 = 0; local_69 < local_68[(ulong)patch_00->type * 0xc]; local_69 = local_69 + 1)
      {
        dataSection->data[(int)((uint)uVar1 + (uint)local_69)] = (uint8_t)uStack_2c;
        uStack_2c = (int)uStack_2c >> 8;
      }
    }
  }
  return;
}

Assistant:

static void applyFilePatches(struct Section *section, struct Section *dataSection)
{
	verbosePrint("Patching section \"%s\"...\n", section->name);
	for (uint32_t patchID = 0; patchID < section->nbPatches; patchID++) {
		struct Patch *patch = &section->patches[patchID];
		int32_t value = computeRPNExpr(patch,
					       (struct Symbol const * const *)
							section->fileSymbols);
		uint16_t offset = patch->offset + section->offset;

		// `jr` is quite unlike the others...
		if (patch->type == PATCHTYPE_JR) {
			// Offset is relative to the byte *after* the operand
			// PC as operand to `jr` is lower than reference PC by 2
			uint16_t address = patch->pcSection->org + patch->pcOffset + 2;
			int16_t jumpOffset = value - address;

			if (!isError && (jumpOffset < -128 || jumpOffset > 127))
				error(patch->src, patch->lineNo,
				      "jr target out of reach (expected -129 < %" PRId16 " < 128)",
				      jumpOffset);
			dataSection->data[offset] = jumpOffset & 0xFF;
		} else {
			// Patch a certain number of bytes
			struct {
				uint8_t size;
				int32_t min;
				int32_t max;
			} const types[PATCHTYPE_INVALID] = {
				AT(PATCHTYPE_BYTE) { 1,      -128,       255 },
				AT(PATCHTYPE_WORD) { 2,    -32768,     65536 },
				AT(PATCHTYPE_LONG) { 4, INT32_MIN, INT32_MAX },
			};

			if (!isError && (value < types[patch->type].min
				      || value > types[patch->type].max))
				error(patch->src, patch->lineNo,
				      "Value %" PRId32 "%s is not %u-bit",
				      value, value < 0 ? " (maybe negative?)" : "",
				      types[patch->type].size * 8U);
			for (uint8_t i = 0; i < types[patch->type].size; i++) {
				dataSection->data[offset + i] = value & 0xFF;
				value >>= 8;
			}
		}
	}
}